

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkInputOutputCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj;
  undefined4 local_4c;
  undefined4 local_48;
  int nFanoutsMax;
  int nFaninsMax;
  int nFanouts;
  int nFanins;
  int i;
  Abc_Obj_t *pNode;
  Vec_Int_t *vFonR_local;
  Vec_Int_t *vFanR_local;
  Vec_Int_t *vFon_local;
  Vec_Int_t *vFan_local;
  Abc_Ntk_t *pNtk_local;
  
  local_48 = 0;
  local_4c = 0;
  for (nFanouts = 0; iVar1 = Abc_NtkCiNum(pNtk), nFanouts < iVar1; nFanouts = nFanouts + 1) {
    pAVar3 = Abc_NtkCi(pNtk,nFanouts);
    iVar1 = Abc_ObjFanoutNum(pAVar3);
    local_4c = Abc_MaxInt(local_4c,iVar1);
  }
  for (nFanouts = 0; iVar1 = Abc_NtkCoNum(pNtk), nFanouts < iVar1; nFanouts = nFanouts + 1) {
    pAVar3 = Abc_NtkCo(pNtk,nFanouts);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    iVar1 = Abc_ObjFaninNum(pAVar3);
    local_48 = Abc_MaxInt(local_48,iVar1);
  }
  Vec_IntFill(vFan,local_48 + 1,0);
  Vec_IntFill(vFon,local_4c + 1,0);
  Vec_IntFill(vFanR,local_48 + 1,0);
  Vec_IntFill(vFonR,local_4c + 1,0);
  for (nFanouts = 0; iVar1 = Abc_NtkCiNum(pNtk), nFanouts < iVar1; nFanouts = nFanouts + 1) {
    pAVar3 = Abc_NtkCi(pNtk,nFanouts);
    iVar1 = Abc_ObjFanoutNum(pAVar3);
    Vec_IntAddToEntry(vFon,iVar1,1);
    uVar2 = Abc_ObjId(pAVar3);
    Vec_IntWriteEntry(vFonR,iVar1,uVar2);
  }
  for (nFanouts = 0; iVar1 = Abc_NtkCoNum(pNtk), nFanouts < iVar1; nFanouts = nFanouts + 1) {
    pAVar3 = Abc_NtkCo(pNtk,nFanouts);
    pObj = Abc_ObjFanin0(pAVar3);
    iVar1 = Abc_ObjFaninNum(pObj);
    Vec_IntAddToEntry(vFan,iVar1,1);
    uVar2 = Abc_ObjId(pAVar3);
    Vec_IntWriteEntry(vFanR,iVar1,uVar2);
  }
  return;
}

Assistant:

void Abc_NtkInputOutputCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    int i, nFanins, nFanouts;
    int nFaninsMax = 0, nFanoutsMax = 0;
    Abc_NtkForEachCi( pNtk, pNode, i )
        nFanoutsMax = Abc_MaxInt( nFanoutsMax, Abc_ObjFanoutNum(pNode) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        nFaninsMax  = Abc_MaxInt( nFaninsMax,  Abc_ObjFaninNum(Abc_ObjFanin0(pNode)) );
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        nFanouts = Abc_ObjFanoutNum( pNode );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFonR, nFanouts, Abc_ObjId(pNode) );
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        nFanins  = Abc_ObjFaninNum( Abc_ObjFanin0(pNode) );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, Abc_ObjId(pNode) );
    }
}